

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::ConcurrentDatabase::prepare(ConcurrentDatabase *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  unique_ptr *puVar5;
  reference pvVar6;
  pointer pDVar7;
  reference ppEVar8;
  StreamArchive *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar9;
  type pDVar10;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra_1;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range4;
  DatabaseInterface *iface;
  iterator iStack_60;
  uint index;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range3;
  size_t extra_index;
  size_t i;
  ConcurrentDatabase *this_local;
  
  if ((((this->mode == Append) || (this->mode == ReadOnly)) ||
      (this->mode == AppendWithReadOnlyAccess)) || (this->mode == OverWrite)) {
    if ((this->mode == ReadOnly) ||
       (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          (&((this->super_DatabaseInterface).impl)->sub_databases_in_whitelist),
       bVar1)) {
      if ((this->mode == ReadOnly) &&
         ((uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0 &&
          (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)))) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) != 0) || (bVar1 = setup_bucket(this), bVar1)) {
          bVar1 = std::
                  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                  ::empty(&((this->super_DatabaseInterface).impl)->imported_metadata);
          if (!bVar1) {
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
            if (bVar1) {
              pDVar7 = std::
                       unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ::operator->(&this->readonly_interface);
              ppEVar8 = std::
                        vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                        ::front(&((this->super_DatabaseInterface).impl)->imported_metadata);
              DatabaseInterface::add_imported_metadata(pDVar7,*ppEVar8);
            }
            for (extra_index = 1;
                sVar4 = std::
                        vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                        ::size(&((this->super_DatabaseInterface).impl)->imported_metadata),
                extra_index < sVar4; extra_index = extra_index + 1) {
              uVar3 = extra_index - 1;
              sVar4 = std::
                      vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                      ::size(&this->extra_readonly);
              if (uVar3 < sVar4) {
                puVar5 = (unique_ptr *)
                         std::
                         vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                         ::operator[](&this->extra_readonly,uVar3);
                bVar1 = std::unique_ptr::operator_cast_to_bool(puVar5);
                if (bVar1) {
                  pvVar6 = std::
                           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                           ::operator[](&this->extra_readonly,uVar3);
                  pDVar7 = std::
                           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           ::operator->(pvVar6);
                  ppEVar8 = std::
                            vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                            ::operator[](&((this->super_DatabaseInterface).impl)->imported_metadata,
                                         extra_index);
                  DatabaseInterface::add_imported_metadata(pDVar7,*ppEVar8);
                }
              }
            }
          }
          if ((this->has_prepared_readonly & 1U) == 0) {
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
            if (bVar1) {
              pDVar7 = std::
                       unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ::operator->(&this->readonly_interface);
              uVar2 = (*pDVar7->_vptr_DatabaseInterface[2])();
              if ((uVar2 & 1) == 0) {
                std::
                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ::reset(&this->readonly_interface,(pointer)0x0);
              }
            }
            __end3 = std::
                     vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                     ::begin(&this->extra_readonly);
            extra = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     *)std::
                       vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                       ::end(&this->extra_readonly);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                               *)&extra), bVar1) {
              puVar5 = (unique_ptr *)
                       __gnu_cxx::
                       __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                       ::operator*(&__end3);
              bVar1 = std::unique_ptr::operator_cast_to_bool(puVar5);
              if (bVar1) {
                this_00 = (StreamArchive *)
                          std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                       *)puVar5);
                StreamArchive::resolve_path(this_00,&this->base_path);
                pDVar7 = std::
                         unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                       *)puVar5);
                uVar2 = (*pDVar7->_vptr_DatabaseInterface[2])();
                if ((uVar2 & 1) == 0) {
                  std::
                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ::reset((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           *)puVar5,(pointer)0x0);
                }
              }
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
              ::operator++(&__end3);
            }
            this_01 = &((this->super_DatabaseInterface).impl)->sub_databases_in_whitelist;
            __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
            iStack_60 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
            while (bVar1 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffffa0), bVar1) {
              puVar9 = __gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator*(&__end3_1);
              uVar2 = *puVar9;
              __range4 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                          *)0x0;
              if (uVar2 == 0) {
                __range4 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                            *)std::
                              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                              ::get(&this->readonly_interface);
              }
              else {
                sVar4 = std::
                        vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                        ::size(&this->extra_readonly);
                if (uVar2 <= sVar4) {
                  pvVar6 = std::
                           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                           ::operator[](&this->extra_readonly,(ulong)(uVar2 - 1));
                  __range4 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                              *)std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::get(pvVar6);
                }
              }
              if ((__range4 !=
                   (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                    *)0x0) &&
                 (bVar1 = DatabaseInterface::add_to_implicit_whitelist
                                    (&this->super_DatabaseInterface,(DatabaseInterface *)__range4),
                 !bVar1)) {
                return false;
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end3_1);
            }
            if (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata ==
                (ExportedMetadataHeader *)0x0) {
              bVar1 = std::unique_ptr::operator_cast_to_bool
                                ((unique_ptr *)&this->readonly_interface);
              if (bVar1) {
                pDVar10 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator*(&this->readonly_interface);
                prime_read_only_hashes(this,pDVar10);
              }
              __end4 = std::
                       vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                       ::begin(&this->extra_readonly);
              extra_1 = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         *)std::
                           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                           ::end(&this->extra_readonly);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                                 *)&extra_1), bVar1) {
                puVar5 = (unique_ptr *)
                         __gnu_cxx::
                         __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                         ::operator*(&__end4);
                bVar1 = std::unique_ptr::operator_cast_to_bool(puVar5);
                if (bVar1) {
                  pDVar10 = std::
                            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                         *)puVar5);
                  prime_read_only_hashes(this,pDVar10);
                }
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                ::operator++(&__end4);
              }
            }
            if (this->mode == Append) {
              std::
              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ::reset(&this->readonly_interface,(pointer)0x0);
              std::
              vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              ::clear(&this->extra_readonly);
            }
          }
          this->has_prepared_readonly = true;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::ReadOnly &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (mode != DatabaseMode::ReadOnly && !impl->sub_databases_in_whitelist.empty())
			return false;

		if (mode == DatabaseMode::ReadOnly && !bucket_dirname.empty() && !bucket_basename.empty())
			return false;

		if (!bucket_dirname.empty() && !setup_bucket())
			return false;

		// Set inherited metadata in sub-databases before we prepare them.
		if (!impl->imported_metadata.empty())
		{
			if (readonly_interface)
				readonly_interface->add_imported_metadata(impl->imported_metadata.front());

			for (size_t i = 1; i < impl->imported_metadata.size(); i++)
			{
				size_t extra_index = i - 1;
				if (extra_index < extra_readonly.size() && extra_readonly[extra_index])
					extra_readonly[extra_index]->add_imported_metadata(impl->imported_metadata[i]);
			}
		}

		if (!has_prepared_readonly)
		{
			// Prepare everything.
			// It's okay if the database doesn't exist.
			if (readonly_interface && !readonly_interface->prepare())
				readonly_interface.reset();

			for (auto &extra : extra_readonly)
			{
				if (extra)
				{
					static_cast<StreamArchive &>(*extra).resolve_path(base_path);
					if (!extra->prepare())
						extra.reset();
				}
			}

			// Promote databases to whitelist.
			for (unsigned index : impl->sub_databases_in_whitelist)
			{
				DatabaseInterface *iface = nullptr;
				if (index == 0)
					iface = readonly_interface.get();
				else if (index <= extra_readonly.size())
					iface = extra_readonly[index - 1].get();

				// It's okay if the archive does not exist, we just ignore it.
				if (iface && !add_to_implicit_whitelist(*iface))
					return false;
			}

			// Prime the hashmaps, however, we'll rely on concurrent metadata if we have it to avoid memory bloat.
			if (!impl->imported_concurrent_metadata)
			{
				if (readonly_interface)
					prime_read_only_hashes(*readonly_interface);

				for (auto &extra : extra_readonly)
					if (extra)
						prime_read_only_hashes(*extra);
			}

			// We only need the database for priming purposes.
			if (mode == DatabaseMode::Append)
			{
				readonly_interface.reset();
				extra_readonly.clear();
			}
		}

		has_prepared_readonly = true;
		return true;
	}